

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiViewportP::ImGuiViewportP(ImGuiViewportP *this)

{
  ImVec2 local_24 [2];
  ImGuiViewportP *local_10;
  ImGuiViewportP_conflict *this_local;
  
  local_10 = this;
  ImGuiViewport::ImGuiViewport(&this->_ImGuiViewport);
  ImVec2::ImVec2((ImVec2 *)&this->LastNameHash);
  ImDrawData::ImDrawData((ImDrawData *)(this->DrawLists + 1));
  ImDrawDataBuilder::ImDrawDataBuilder((ImDrawDataBuilder *)&(this->DrawDataP).OwnerViewport);
  ImVec2::ImVec2((ImVec2 *)&(this->DrawDataBuilder).Layers[1].Data);
  ImVec2::ImVec2(&this->LastPlatformPos);
  ImVec2::ImVec2(&this->LastPlatformSize);
  ImVec2::ImVec2(&this->LastRendererSize);
  ImVec2::ImVec2(&this->WorkOffsetMin);
  ImVec2::ImVec2(&this->WorkOffsetMax);
  ImVec2::ImVec2(&this->BuildWorkOffsetMin);
  *(undefined4 *)&(this->_ImGuiViewport).field_0x5c = 0xffffffff;
  this->LastFrameActive = -1;
  *(undefined4 *)((long)&this->Window + 4) = 0xffffffff;
  *(undefined4 *)&this->Window = 0xffffffff;
  this->Idx = -1;
  this->LastFrontMostStampCount = 0;
  this->Alpha = 1.0;
  (this->LastPos).y = 1.0;
  *(undefined2 *)&this->LastAlpha = 0xffff;
  *(undefined1 *)((long)&this->LastAlpha + 2) = 0;
  this->PlatformMonitor = 0;
  this->PlatformWindowCreated = false;
  *(undefined5 *)&this->field_0x83 = 0;
  this->DrawLists[0] = (ImDrawList *)0x0;
  this->DrawListsLastFrame[0] = 0;
  this->DrawListsLastFrame[1] = 0;
  ImVec2::ImVec2(local_24,3.4028235e+38,3.4028235e+38);
  this->LastPlatformSize = local_24[0];
  this->LastPlatformPos = this->LastPlatformSize;
  (this->DrawDataBuilder).Layers[1].Data = (ImDrawList **)this->LastPlatformPos;
  return;
}

Assistant:

ImGuiViewportP()                    { Idx = -1; LastFrameActive = DrawListsLastFrame[0] = DrawListsLastFrame[1] = LastFrontMostStampCount = -1; LastNameHash = 0; Alpha = LastAlpha = 1.0f; PlatformMonitor = -1; PlatformWindowCreated = false; Window = NULL; DrawLists[0] = DrawLists[1] = NULL; LastPlatformPos = LastPlatformSize = LastRendererSize = ImVec2(FLT_MAX, FLT_MAX); }